

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_messaging_ll.c
# Opt level: O2

IOTHUB_MESSAGING_RESULT
IoTHubMessaging_LL_Send
          (IOTHUB_MESSAGING_HANDLE messagingHandle,char *deviceId,IOTHUB_MESSAGE_HANDLE message,
          IOTHUB_SEND_COMPLETE_CALLBACK sendCompleteCallback,void *userContextCallback)

{
  size_t sVar1;
  int iVar2;
  IOTHUBMESSAGE_CONTENT_TYPE IVar3;
  IOTHUB_MESSAGE_RESULT IVar4;
  MAP_RESULT MVar5;
  size_t sVar6;
  char *pcVar7;
  LOGGER_LOG p_Var8;
  uchar *puVar9;
  char **ppcVar10;
  MESSAGE_HANDLE pMVar11;
  AMQP_VALUE pAVar12;
  MAP_HANDLE handle;
  AMQP_VALUE value;
  SEND_CALLBACK_DATA *send_data;
  LIST_ITEM_HANDLE pLVar13;
  ASYNC_OPERATION_HANDLE pAVar14;
  int iVar15;
  IOTHUB_MESSAGING_RESULT IVar16;
  ulong uVar17;
  BINARY_DATA amqp_data;
  uchar *contentByteArr;
  MESSAGE_HANDLE local_60;
  AMQP_VALUE local_58;
  char *local_50;
  size_t local_48;
  char **propertyValues;
  AMQP_VALUE local_38;
  
  if (messagingHandle == (IOTHUB_MESSAGING_HANDLE)0x0) {
    p_Var8 = xlogging_get_log_function();
    if (p_Var8 == (LOGGER_LOG)0x0) {
      return IOTHUB_MESSAGING_INVALID_ARG;
    }
    pcVar7 = "Input parameter messagingHandle cannot be NULL";
    iVar2 = 0x5a6;
  }
  else if (deviceId == (char *)0x0) {
    p_Var8 = xlogging_get_log_function();
    if (p_Var8 == (LOGGER_LOG)0x0) {
      return IOTHUB_MESSAGING_INVALID_ARG;
    }
    pcVar7 = "Input parameter deviceId cannot be NULL";
    iVar2 = 0x5ab;
  }
  else {
    if (message != (IOTHUB_MESSAGE_HANDLE)0x0) {
      if (messagingHandle->isOpened == 0) {
        p_Var8 = xlogging_get_log_function();
        IVar16 = IOTHUB_MESSAGING_ERROR;
        if (p_Var8 == (LOGGER_LOG)0x0) {
          return IOTHUB_MESSAGING_ERROR;
        }
        pcVar7 = "Messaging is not opened - call IoTHubMessaging_LL_Open to open";
        iVar2 = 0x5b5;
        goto LAB_001300db;
      }
      if (messagingHandle->max_send_queue_size <= messagingHandle->send_queue_size) {
        p_Var8 = xlogging_get_log_function();
        IVar16 = IOTHUB_MESSAGING_QUEUE_FULL;
        if (p_Var8 == (LOGGER_LOG)0x0) {
          return IOTHUB_MESSAGING_QUEUE_FULL;
        }
        pcVar7 = "Send queue is full";
        iVar2 = 0x5ba;
        goto LAB_001300db;
      }
      sVar6 = strlen(deviceId);
      pcVar7 = (char *)malloc(sVar6 + 0x2c);
      if (pcVar7 == (char *)0x0) {
        p_Var8 = xlogging_get_log_function();
        if (p_Var8 != (LOGGER_LOG)0x0) {
          (*p_Var8)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                    ,"createDeviceDestinationString",0x28e,1,
                    "Could not create device destination string.");
        }
      }
      else {
        local_50 = pcVar7;
        iVar2 = snprintf(pcVar7,sVar6 + 0x2c,"/devices/%s/messages/deviceBound",deviceId);
        if (-1 < iVar2) {
          IVar3 = IoTHubMessage_GetContentType(message);
          if (IVar3 == IOTHUBMESSAGE_STRING) {
            puVar9 = (uchar *)IoTHubMessage_GetString(message);
            if (puVar9 == (uchar *)0x0) {
              p_Var8 = xlogging_get_log_function();
              if (p_Var8 != (LOGGER_LOG)0x0) {
                pcVar7 = 
                "Failed getting the STRING representation of the IOTHUB_MESSAGE_HANDLE instance.";
                iVar2 = 0x1b7;
                goto LAB_0013034c;
              }
              goto LAB_00130351;
            }
            ppcVar10 = (char **)strlen((char *)puVar9);
LAB_0013026c:
            pMVar11 = message_create();
            if (pMVar11 != (MESSAGE_HANDLE)0x0) {
              local_60 = pMVar11;
              pAVar12 = amqpvalue_create_string(local_50);
              pMVar11 = local_60;
              if (pAVar12 == (AMQP_VALUE)0x0) {
                p_Var8 = xlogging_get_log_function();
                IVar16 = IOTHUB_MESSAGING_ERROR;
                if (p_Var8 != (LOGGER_LOG)0x0) {
                  (*p_Var8)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                            ,"IoTHubMessaging_LL_Send",0x5da,1,
                            "Could not create properties for message - amqpvalue_create_string");
                }
              }
              else {
                amqp_data.length = (size_t)ppcVar10;
                amqp_data.bytes = puVar9;
                local_38 = pAVar12;
                iVar2 = message_add_body_amqp_data(local_60,amqp_data);
                if (iVar2 == 0) {
                  contentByteArr = (uchar *)0x0;
                  iVar2 = message_get_properties(pMVar11,(PROPERTIES_HANDLE *)&contentByteArr);
                  if (iVar2 == 0) {
                    if ((contentByteArr == (uchar *)0x0) &&
                       (contentByteArr = (uchar *)properties_create(),
                       (PROPERTIES_HANDLE)contentByteArr == (PROPERTIES_HANDLE)0x0)) {
                      p_Var8 = xlogging_get_log_function();
                      if (p_Var8 != (LOGGER_LOG)0x0) {
                        iVar2 = 0;
                        pcVar7 = 
                        "Failed to create properties map for uAMQP message (error code %d).";
                        iVar15 = 0x120;
                        goto LAB_0013041a;
                      }
                    }
                    else {
                      puVar9 = contentByteArr;
                      pcVar7 = IoTHubMessage_GetMessageId(message);
                      if (pcVar7 == (char *)0x0) {
LAB_00130563:
                        puVar9 = contentByteArr;
                        pcVar7 = IoTHubMessage_GetCorrelationId(message);
                        if (pcVar7 == (char *)0x0) {
LAB_0013064d:
                          iVar2 = properties_set_to((PROPERTIES_HANDLE)contentByteArr,local_38);
                          if (iVar2 == 0) {
                            iVar2 = message_set_properties
                                              (local_60,(PROPERTIES_HANDLE)contentByteArr);
                            if (iVar2 == 0) {
                              properties_destroy((PROPERTIES_HANDLE)contentByteArr);
                              local_48 = 0;
                              handle = IoTHubMessage_Properties(message);
                              MVar5 = Map_GetInternals(handle,(char ***)&contentByteArr,
                                                       &propertyValues,&local_48);
                              if (MVar5 == MAP_OK) {
                                if (local_48 == 0) {
LAB_001309d7:
                                  if (messagingHandle->send_queue_size <
                                      messagingHandle->max_send_queue_size) {
                                    send_data = (SEND_CALLBACK_DATA *)malloc(0x20);
                                    if (send_data == (SEND_CALLBACK_DATA *)0x0) {
                                      p_Var8 = xlogging_get_log_function();
                                      if (p_Var8 != (LOGGER_LOG)0x0) {
                                        pcVar7 = "Failed allocating SEND_CALLBACK_DATA";
                                        iVar2 = 0x71;
                                        goto LAB_00130afe;
                                      }
                                    }
                                    else {
                                      sVar1 = messagingHandle->next_send_data_id;
                                      messagingHandle->next_send_data_id = sVar1 + 1;
                                      send_data->id = sVar1;
                                      send_data->messagingHandle = messagingHandle;
                                      send_data->callback = sendCompleteCallback;
                                      send_data->userContext = userContextCallback;
                                      pLVar13 = singlylinkedlist_add
                                                          (messagingHandle->send_callback_data,
                                                           send_data);
                                      if (pLVar13 != (LIST_ITEM_HANDLE)0x0) {
                                        messagingHandle->send_queue_size =
                                             messagingHandle->send_queue_size + 1;
                                        IVar16 = IOTHUB_MESSAGING_OK;
                                        pAVar14 = messagesender_send_async
                                                            (messagingHandle->message_sender,
                                                             local_60,
                                                  IoTHubMessaging_LL_SendMessageComplete,send_data,0
                                                  );
                                        if (pAVar14 == (ASYNC_OPERATION_HANDLE)0x0) {
                                          p_Var8 = xlogging_get_log_function();
                                          if (p_Var8 != (LOGGER_LOG)0x0) {
                                            (*p_Var8)(AZ_LOG_ERROR,
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                                                  ,"IoTHubMessaging_LL_Send",0x5ff,1,
                                                  "messagesender_send_async failed.");
                                          }
                                          dequeue_send_callback_data(send_data);
                                          IVar16 = IOTHUB_MESSAGING_ERROR;
                                        }
                                        goto LAB_0013071d;
                                      }
                                      p_Var8 = xlogging_get_log_function();
                                      if (p_Var8 != (LOGGER_LOG)0x0) {
                                        (*p_Var8)(AZ_LOG_ERROR,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                                                  ,"enqueue_send_callback_data",0x80,1,
                                                  "Failed adding context to send_callback_data");
                                      }
                                      free(send_data);
                                    }
                                  }
                                  else {
                                    p_Var8 = xlogging_get_log_function();
                                    if (p_Var8 != (LOGGER_LOG)0x0) {
                                      pcVar7 = "Send queue is full";
                                      iVar2 = 0x69;
LAB_00130afe:
                                      (*p_Var8)(AZ_LOG_ERROR,
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                                                ,"enqueue_send_callback_data",iVar2,1,pcVar7);
                                    }
                                  }
                                  p_Var8 = xlogging_get_log_function();
                                  IVar16 = IOTHUB_MESSAGING_ERROR;
                                  if (p_Var8 != (LOGGER_LOG)0x0) {
                                    pcVar7 = "Failed enqueueing message.";
                                    iVar2 = 0x5fa;
                                    goto LAB_00130718;
                                  }
                                  goto LAB_0013071d;
                                }
                                local_58 = amqpvalue_create_map();
                                if (local_58 == (AMQP_VALUE)0x0) {
                                  p_Var8 = xlogging_get_log_function();
                                  if (p_Var8 != (LOGGER_LOG)0x0) {
                                    pcVar7 = "Failed to create uAMQP map for the properties.";
                                    iVar2 = 0x15c;
                                    goto LAB_00130839;
                                  }
                                }
                                else {
                                  for (uVar17 = 0; uVar17 < local_48; uVar17 = uVar17 + 1) {
                                    pAVar12 = amqpvalue_create_string
                                                        (*(char **)(contentByteArr + uVar17 * 8));
                                    if (pAVar12 == (AMQP_VALUE)0x0) {
                                      p_Var8 = xlogging_get_log_function();
                                      if (p_Var8 != (LOGGER_LOG)0x0) {
                                        pcVar7 = "Failed to create uAMQP property key name.";
                                        iVar2 = 0x169;
LAB_00130905:
                                        (*p_Var8)(AZ_LOG_ERROR,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                                                  ,"addApplicationPropertiesToAMQPMessage",iVar2,1,
                                                  pcVar7);
                                      }
                                      break;
                                    }
                                    value = amqpvalue_create_string(propertyValues[uVar17]);
                                    if (value == (AMQP_VALUE)0x0) {
                                      p_Var8 = xlogging_get_log_function();
                                      if (p_Var8 != (LOGGER_LOG)0x0) {
                                        pcVar7 = "Failed to create uAMQP property key value.";
                                        iVar2 = 0x170;
                                        goto LAB_00130905;
                                      }
                                      break;
                                    }
                                    iVar2 = amqpvalue_set_map_value(local_58,pAVar12,value);
                                    if (iVar2 != 0) {
                                      p_Var8 = xlogging_get_log_function();
                                      if (p_Var8 != (LOGGER_LOG)0x0) {
                                        pcVar7 = 
                                        "Failed to set key/value into the the uAMQP property map.";
                                        iVar2 = 0x177;
                                        goto LAB_00130905;
                                      }
                                      break;
                                    }
                                    amqpvalue_destroy(value);
                                    amqpvalue_destroy(pAVar12);
                                  }
                                  if (local_48 == uVar17) {
                                    iVar2 = message_set_application_properties(local_60,local_58);
                                    if (iVar2 == 0) {
                                      amqpvalue_destroy(local_58);
                                      goto LAB_001309d7;
                                    }
                                    p_Var8 = xlogging_get_log_function();
                                    if (p_Var8 != (LOGGER_LOG)0x0) {
                                      pcVar7 = 
                                      "Failed to transfer the message properties to the uAMQP message."
                                      ;
                                      iVar2 = 0x184;
                                      goto LAB_00130984;
                                    }
                                  }
                                  else {
                                    p_Var8 = xlogging_get_log_function();
                                    if (p_Var8 != (LOGGER_LOG)0x0) {
                                      pcVar7 = 
                                      "Failed to set application property into the the uAMQP property map."
                                      ;
                                      iVar2 = 0x18e;
LAB_00130984:
                                      (*p_Var8)(AZ_LOG_ERROR,
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                                                ,"addApplicationPropertiesToAMQPMessage",iVar2,1,
                                                pcVar7);
                                    }
                                  }
                                  amqpvalue_destroy(local_58);
                                }
                              }
                              else {
                                p_Var8 = xlogging_get_log_function();
                                if (p_Var8 != (LOGGER_LOG)0x0) {
                                  pcVar7 = "Failed to get the internals of the property map.";
                                  iVar2 = 0x151;
LAB_00130839:
                                  (*p_Var8)(AZ_LOG_ERROR,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                                            ,"addApplicationPropertiesToAMQPMessage",iVar2,1,pcVar7)
                                  ;
                                }
                              }
                              p_Var8 = xlogging_get_log_function();
                              IVar16 = IOTHUB_MESSAGING_ERROR;
                              if (p_Var8 != (LOGGER_LOG)0x0) {
                                pcVar7 = 
                                "Failed setting application properties of the uAMQP message.";
                                iVar2 = 0x5f1;
                                goto LAB_00130718;
                              }
                              goto LAB_0013071d;
                            }
                            p_Var8 = xlogging_get_log_function();
                            if (p_Var8 != (LOGGER_LOG)0x0) {
                              pcVar7 = 
                              "Failed to set properties map on uAMQP message (error code %d).";
                              iVar2 = 0x138;
                              goto LAB_001306d8;
                            }
                          }
                          else {
                            p_Var8 = xlogging_get_log_function();
                            if (p_Var8 != (LOGGER_LOG)0x0) {
                              pcVar7 = 
                              "Could not create properties for message - properties_set_to failed";
                              iVar2 = 0x133;
                              goto LAB_001306d8;
                            }
                          }
                        }
                        else {
                          pAVar12 = amqpvalue_create_string(pcVar7);
                          if (pAVar12 == (AMQP_VALUE)0x0) {
                            p_Var8 = xlogging_get_log_function();
                            if (p_Var8 != (LOGGER_LOG)0x0) {
                              (*p_Var8)(AZ_LOG_ERROR,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                                        ,"setCorrelationId",0xf7,1,
                                        "Failed to create an AMQP_VALUE for the messageId property value."
                                       );
                            }
                          }
                          else {
                            iVar2 = properties_set_correlation_id((PROPERTIES_HANDLE)puVar9,pAVar12)
                            ;
                            if (iVar2 == 0) {
                              amqpvalue_destroy(pAVar12);
                              goto LAB_0013064d;
                            }
                            p_Var8 = xlogging_get_log_function();
                            if (p_Var8 != (LOGGER_LOG)0x0) {
                              (*p_Var8)(AZ_LOG_INFO,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                                        ,"setCorrelationId",0x100,1,
                                        "Failed to set value of uAMQP message \'message-id\' property (%d)."
                                        ,iVar2);
                            }
                            amqpvalue_destroy(pAVar12);
                          }
                          p_Var8 = xlogging_get_log_function();
                          if (p_Var8 != (LOGGER_LOG)0x0) {
                            pcVar7 = "Failed to set uampq correlationId.";
                            iVar2 = 300;
                            goto LAB_001306d8;
                          }
                        }
                      }
                      else {
                        pAVar12 = amqpvalue_create_string(pcVar7);
                        if (pAVar12 == (AMQP_VALUE)0x0) {
                          p_Var8 = xlogging_get_log_function();
                          if (p_Var8 != (LOGGER_LOG)0x0) {
                            (*p_Var8)(AZ_LOG_ERROR,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                                      ,"setMessageId",0xd2,1,
                                      "Failed to create an AMQP_VALUE for the messageId property value."
                                     );
                          }
                        }
                        else {
                          iVar2 = properties_set_message_id((PROPERTIES_HANDLE)puVar9,pAVar12);
                          if (iVar2 == 0) {
                            amqpvalue_destroy(pAVar12);
                            goto LAB_00130563;
                          }
                          p_Var8 = xlogging_get_log_function();
                          if (p_Var8 != (LOGGER_LOG)0x0) {
                            (*p_Var8)(AZ_LOG_INFO,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                                      ,"setMessageId",0xdb,1,
                                      "Failed to set value of uAMQP message \'message-id\' property (%d)."
                                      ,iVar2);
                          }
                          amqpvalue_destroy(pAVar12);
                        }
                        p_Var8 = xlogging_get_log_function();
                        if (p_Var8 != (LOGGER_LOG)0x0) {
                          pcVar7 = "Failed to set uampq messageId.";
                          iVar2 = 0x127;
LAB_001306d8:
                          (*p_Var8)(AZ_LOG_ERROR,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                                    ,"addPropertiesToAMQPMessage",iVar2,1,pcVar7);
                        }
                      }
                      properties_destroy((PROPERTIES_HANDLE)contentByteArr);
                    }
                  }
                  else {
                    p_Var8 = xlogging_get_log_function();
                    if (p_Var8 != (LOGGER_LOG)0x0) {
                      pcVar7 = "Failed to get properties map from uAMQP message (error code %d).";
                      iVar15 = 0x11a;
LAB_0013041a:
                      (*p_Var8)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                                ,"addPropertiesToAMQPMessage",iVar15,1,pcVar7,iVar2);
                    }
                  }
                  p_Var8 = xlogging_get_log_function();
                  IVar16 = IOTHUB_MESSAGING_ERROR;
                  if (p_Var8 != (LOGGER_LOG)0x0) {
                    pcVar7 = "Failed setting properties of the uAMQP message.";
                    iVar2 = 0x5ec;
                    goto LAB_00130718;
                  }
                }
                else {
                  p_Var8 = xlogging_get_log_function();
                  IVar16 = IOTHUB_MESSAGING_ERROR;
                  if (p_Var8 != (LOGGER_LOG)0x0) {
                    pcVar7 = "Failed setting the body of the uAMQP message.";
                    iVar2 = 0x5e7;
LAB_00130718:
                    IVar16 = IOTHUB_MESSAGING_ERROR;
                    (*p_Var8)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                              ,"IoTHubMessaging_LL_Send",iVar2,1,pcVar7);
                  }
                }
LAB_0013071d:
                amqpvalue_destroy(local_38);
              }
              message_destroy(local_60);
              goto LAB_00130731;
            }
            p_Var8 = xlogging_get_log_function();
            IVar16 = IOTHUB_MESSAGING_ERROR;
            if (p_Var8 == (LOGGER_LOG)0x0) goto LAB_00130731;
            pcVar7 = "Could not create a message.";
            iVar2 = 0x5d3;
          }
          else {
            if (IVar3 == IOTHUBMESSAGE_BYTEARRAY) {
              IVar4 = IoTHubMessage_GetByteArray(message,&contentByteArr,(size_t *)&propertyValues);
              ppcVar10 = propertyValues;
              puVar9 = contentByteArr;
              if (IVar4 == IOTHUB_MESSAGE_OK) goto LAB_0013026c;
              p_Var8 = xlogging_get_log_function();
              if (p_Var8 != (LOGGER_LOG)0x0) {
                pcVar7 = 
                "Failed getting the BYTE array representation of the IOTHUB_MESSAGE_HANDLE instance."
                ;
                iVar2 = 0x1aa;
                goto LAB_0013034c;
              }
            }
            else {
              p_Var8 = xlogging_get_log_function();
              if (p_Var8 != (LOGGER_LOG)0x0) {
                pcVar7 = 
                "Cannot parse IOTHUB_MESSAGE_HANDLE with content type IOTHUBMESSAGE_UNKNOWN.";
                iVar2 = 0x1c3;
LAB_0013034c:
                (*p_Var8)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                          ,"getMessageContentAndSize",iVar2,1,pcVar7);
              }
            }
LAB_00130351:
            p_Var8 = xlogging_get_log_function();
            IVar16 = IOTHUB_MESSAGING_ERROR;
            if (p_Var8 == (LOGGER_LOG)0x0) goto LAB_00130731;
            pcVar7 = 
            "Failed getting the message content and message size from IOTHUB_MESSAGE_HANDLE instance."
            ;
            iVar2 = 0x5c9;
          }
          IVar16 = IOTHUB_MESSAGING_ERROR;
          (*p_Var8)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                    ,"IoTHubMessaging_LL_Send",iVar2,1,pcVar7);
LAB_00130731:
          free(local_50);
          return IVar16;
        }
        p_Var8 = xlogging_get_log_function();
        if (p_Var8 != (LOGGER_LOG)0x0) {
          (*p_Var8)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                    ,"createDeviceDestinationString",0x295,1,
                    "sprintf_s failed for deviceDestinationString.");
        }
        free(local_50);
      }
      p_Var8 = xlogging_get_log_function();
      IVar16 = IOTHUB_MESSAGING_ERROR;
      if (p_Var8 == (LOGGER_LOG)0x0) {
        return IOTHUB_MESSAGING_ERROR;
      }
      pcVar7 = "Could not create a message.";
      iVar2 = 0x5bf;
      goto LAB_001300db;
    }
    p_Var8 = xlogging_get_log_function();
    if (p_Var8 == (LOGGER_LOG)0x0) {
      return IOTHUB_MESSAGING_INVALID_ARG;
    }
    pcVar7 = "Input parameter message cannot be NULL";
    iVar2 = 0x5b0;
  }
  IVar16 = IOTHUB_MESSAGING_INVALID_ARG;
LAB_001300db:
  (*p_Var8)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
            ,"IoTHubMessaging_LL_Send",iVar2,1,pcVar7);
  return IVar16;
}

Assistant:

IOTHUB_MESSAGING_RESULT IoTHubMessaging_LL_Send(IOTHUB_MESSAGING_HANDLE messagingHandle, const char* deviceId, IOTHUB_MESSAGE_HANDLE message, IOTHUB_SEND_COMPLETE_CALLBACK sendCompleteCallback, void* userContextCallback)
{
    IOTHUB_MESSAGING_RESULT result;

    // There is no support for module sending message for callers, but most of plumbing is available should this be enabled via a new API.
    const char* moduleId = NULL;

    char* deviceDestinationString;

    if (messagingHandle == NULL)
    {
        LogError("Input parameter messagingHandle cannot be NULL");
        result = IOTHUB_MESSAGING_INVALID_ARG;
    }
    else if (deviceId == NULL)
    {
        LogError("Input parameter deviceId cannot be NULL");
        result = IOTHUB_MESSAGING_INVALID_ARG;
    }
    else if (message == NULL)
    {
        LogError("Input parameter message cannot be NULL");
        result = IOTHUB_MESSAGING_INVALID_ARG;
    }
    else if (messagingHandle->isOpened == 0)
    {
        LogError("Messaging is not opened - call IoTHubMessaging_LL_Open to open");
        result = IOTHUB_MESSAGING_ERROR;
    }
    else if (is_send_queue_full(messagingHandle))
    {
        LogError("Send queue is full");
        result = IOTHUB_MESSAGING_QUEUE_FULL;
    }
    else if ((deviceDestinationString = createDeviceDestinationString(deviceId, moduleId)) == NULL)
    {
        LogError("Could not create a message.");
        result = IOTHUB_MESSAGING_ERROR;
    }
    else
    {
        unsigned const char* messageContent;
        size_t messageContentSize;

        if (getMessageContentAndSize(message, &messageContent, &messageContentSize) != 0)
        {
            LogError("Failed getting the message content and message size from IOTHUB_MESSAGE_HANDLE instance.");
            result = IOTHUB_MESSAGING_ERROR;
        }
        else
        {
            MESSAGE_HANDLE amqpMessage;
            AMQP_VALUE to_amqp_value;

            if ((amqpMessage = message_create()) == NULL)
            {
                LogError("Could not create a message.");
                result = IOTHUB_MESSAGING_ERROR;
            }
            else
            {
                if ((to_amqp_value = amqpvalue_create_string(deviceDestinationString)) == NULL)
                {
                    LogError("Could not create properties for message - amqpvalue_create_string");
                    result = IOTHUB_MESSAGING_ERROR;
                }
                else
                {
                    BINARY_DATA binary_data;

                    binary_data.bytes = messageContent;
                    binary_data.length = messageContentSize;

                    if (message_add_body_amqp_data(amqpMessage, binary_data) != 0)
                    {
                        
                        LogError("Failed setting the body of the uAMQP message.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if (addPropertiesToAMQPMessage(message, amqpMessage, to_amqp_value) != 0)
                    {
                        LogError("Failed setting properties of the uAMQP message.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else if (addApplicationPropertiesToAMQPMessage(message, amqpMessage) != 0)
                    {
                        LogError("Failed setting application properties of the uAMQP message.");
                        result = IOTHUB_MESSAGING_ERROR;
                    }
                    else
                    {
                        SEND_CALLBACK_DATA* send_data = enqueue_send_callback_data(messagingHandle, sendCompleteCallback, userContextCallback);

                        if (send_data == NULL)
                        {
                            LogError("Failed enqueueing message.");
                            result = IOTHUB_MESSAGING_ERROR;
                        }
                        else if (messagesender_send_async(messagingHandle->message_sender, amqpMessage, IoTHubMessaging_LL_SendMessageComplete, send_data, 0) == NULL)
                        {
                            LogError("messagesender_send_async failed.");
                            dequeue_send_callback_data(send_data);
                            result = IOTHUB_MESSAGING_ERROR;
                        }
                        else
                        {
                            result = IOTHUB_MESSAGING_OK;
                        }
                    }
                    amqpvalue_destroy(to_amqp_value);
                }
                message_destroy(amqpMessage);
            }
        }
        free(deviceDestinationString);
    }
    return result;
}